

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCustomCommandCommand.cxx
# Opt level: O3

bool __thiscall
cmAddCustomCommandCommand::InitialPass
          (cmAddCustomCommandCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  pointer pcVar2;
  long *plVar3;
  cmMakefile *this_00;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  PolicyStatus PVar10;
  pointer pbVar11;
  char *pcVar12;
  cmGlobalGenerator *pcVar13;
  cmSourceFile *pcVar14;
  cmCustomCommand *pcVar15;
  char *pcVar16;
  ostream *poVar17;
  PolicyID id;
  bool bVar18;
  MessageType t;
  value_type *__x;
  undefined8 uVar19;
  _Alloc_hider _Var20;
  CustomCommandType type;
  pointer pbVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  string filename;
  cmCustomCommandLine currentLine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output;
  bool local_368;
  char *local_360;
  cmCustomCommandLines commandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  byproducts;
  string working;
  ImplicitDependsList implicit_depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string target;
  string source;
  string dep_1;
  string depfile;
  string dep;
  ios_base local_1c8 [272];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  string implicit_depends_lang;
  string comment_buffer;
  string main_dependency;
  
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar1 - (long)pbVar11) < 0x80) {
    dep._M_dataplus._M_p = (pointer)&dep.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&dep,"called with wrong number of arguments.","");
    cmCommand::SetError(&this->super_cmCommand,&dep);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dep._M_dataplus._M_p != &dep.field_2) {
      operator_delete(dep._M_dataplus._M_p,dep.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  source._M_dataplus._M_p = (pointer)&source.field_2;
  pcVar16 = (char *)0x0;
  source._M_string_length = 0;
  source.field_2._M_local_buf[0] = '\0';
  target._M_dataplus._M_p = (pointer)&target.field_2;
  target._M_string_length = 0;
  target.field_2._M_local_buf[0] = '\0';
  main_dependency._M_dataplus._M_p = (pointer)&main_dependency.field_2;
  main_dependency._M_string_length = 0;
  main_dependency.field_2._M_local_buf[0] = '\0';
  working._M_dataplus._M_p = (pointer)&working.field_2;
  working._M_string_length = 0;
  working.field_2._M_local_buf[0] = '\0';
  depfile._M_dataplus._M_p = (pointer)&depfile.field_2;
  depfile._M_string_length = 0;
  depfile.field_2._M_local_buf[0] = '\0';
  comment_buffer._M_dataplus._M_p = (pointer)&comment_buffer.field_2;
  comment_buffer._M_string_length = 0;
  comment_buffer.field_2._M_local_buf[0] = '\0';
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  output.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  output.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  output.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  implicit_depends_lang._M_dataplus._M_p = (pointer)&implicit_depends_lang.field_2;
  implicit_depends_lang._M_string_length = 0;
  implicit_depends_lang.field_2._M_local_buf[0] = '\0';
  implicit_depends.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  implicit_depends.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  implicit_depends.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (pbVar1 == pbVar11) {
    type = POST_BUILD;
    bVar5 = true;
    bVar4 = false;
    bVar18 = false;
    local_368 = false;
    local_360 = pcVar16;
  }
  else {
    type = POST_BUILD;
    iVar9 = 0xd;
    local_360 = (char *)0x0;
    bVar6 = 0;
    bVar4 = false;
    bVar18 = false;
    local_368 = false;
    do {
      __x = pbVar11 + (long)pcVar16;
      iVar8 = std::__cxx11::string::compare((char *)__x);
      if (iVar8 == 0) {
        iVar9 = 0;
        goto LAB_00334b35;
      }
      iVar8 = std::__cxx11::string::compare((char *)__x);
      if (iVar8 == 0) {
        if (currentLine.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            currentLine.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar9 = 1;
        }
        else {
          iVar9 = 1;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                    (&commandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                     &currentLine);
          pbVar1 = currentLine.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar11 = currentLine.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (currentLine.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              currentLine.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar22 = &(currentLine.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar3 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar22 + -1))->_M_dataplus)._M_p;
              if (paVar22 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar3) {
                operator_delete(plVar3,paVar22->_M_allocated_capacity + 1);
              }
              pbVar21 = (pointer)(paVar22 + 1);
              paVar22 = paVar22 + 2;
            } while (pbVar21 != pbVar1);
            currentLine.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar11;
          }
        }
        goto LAB_00334b35;
      }
      iVar8 = std::__cxx11::string::compare((char *)__x);
      if (iVar8 == 0) {
        type = PRE_BUILD;
        goto LAB_00334b35;
      }
      iVar8 = std::__cxx11::string::compare((char *)__x);
      if (iVar8 == 0) {
        type = PRE_LINK;
        goto LAB_00334b35;
      }
      iVar8 = std::__cxx11::string::compare((char *)__x);
      if (iVar8 == 0) {
        type = POST_BUILD;
        goto LAB_00334b35;
      }
      iVar8 = std::__cxx11::string::compare((char *)__x);
      if (iVar8 == 0) {
        bVar6 = 1;
        goto LAB_00334b35;
      }
      iVar8 = std::__cxx11::string::compare((char *)__x);
      if (iVar8 == 0) {
        bVar4 = true;
        goto LAB_00334b35;
      }
      iVar8 = std::__cxx11::string::compare((char *)__x);
      if (iVar8 == 0) {
        bVar18 = true;
        goto LAB_00334b35;
      }
      iVar8 = std::__cxx11::string::compare((char *)__x);
      if (iVar8 == 0) {
        local_368 = true;
        goto LAB_00334b35;
      }
      iVar8 = std::__cxx11::string::compare((char *)__x);
      if (iVar8 == 0) {
        iVar9 = 2;
        goto LAB_00334b35;
      }
      iVar8 = std::__cxx11::string::compare((char *)__x);
      if (iVar8 == 0) goto LAB_00334b35;
      iVar8 = std::__cxx11::string::compare((char *)__x);
      if (iVar8 == 0) {
        iVar9 = 3;
        goto LAB_00334b35;
      }
      iVar8 = std::__cxx11::string::compare((char *)__x);
      if (iVar8 == 0) {
        iVar9 = 8;
        goto LAB_00334b35;
      }
      iVar8 = std::__cxx11::string::compare((char *)__x);
      if (iVar8 == 0) {
        iVar9 = 7;
        goto LAB_00334b35;
      }
      iVar8 = std::__cxx11::string::compare((char *)__x);
      if (iVar8 == 0) {
        iVar9 = 9;
        goto LAB_00334b35;
      }
      iVar8 = std::__cxx11::string::compare((char *)__x);
      if (iVar8 == 0) {
        iVar9 = 0xb;
        goto LAB_00334b35;
      }
      iVar8 = std::__cxx11::string::compare((char *)__x);
      if (iVar8 == 0) {
        iVar9 = 6;
        goto LAB_00334b35;
      }
      iVar8 = std::__cxx11::string::compare((char *)__x);
      if (iVar8 == 0) {
        iVar9 = 4;
        goto LAB_00334b35;
      }
      iVar8 = std::__cxx11::string::compare((char *)__x);
      if (iVar8 == 0) {
        iVar9 = 10;
        goto LAB_00334b35;
      }
      iVar8 = std::__cxx11::string::compare((char *)__x);
      if (iVar8 == 0) {
        pcVar13 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
        (*pcVar13->_vptr_cmGlobalGenerator[3])(&dep,pcVar13);
        iVar8 = std::__cxx11::string::compare((char *)&dep);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dep._M_dataplus._M_p != &dep.field_2) {
          operator_delete(dep._M_dataplus._M_p,dep.field_2._M_allocated_capacity + 1);
        }
        iVar9 = 0xc;
        if (iVar8 == 0) goto LAB_00334b35;
        pcVar13 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
        (*pcVar13->_vptr_cmGlobalGenerator[3])(&filename,pcVar13);
        std::operator+(&dep,"Option DEPFILE not supported by ",&filename);
        cmCommand::SetError(&this->super_cmCommand,&dep);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dep._M_dataplus._M_p != &dep.field_2) {
          operator_delete(dep._M_dataplus._M_p,dep.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)filename._M_dataplus._M_p == &filename.field_2) goto LAB_003350c9;
        uVar19 = CONCAT71(filename.field_2._M_allocated_capacity._1_7_,
                          filename.field_2._M_local_buf[0]);
        _Var20._M_p = filename._M_dataplus._M_p;
        goto LAB_003350c1;
      }
      filename._M_dataplus._M_p = (pointer)&filename.field_2;
      filename._M_string_length = 0;
      filename.field_2._M_local_buf[0] = '\0';
      if (iVar9 - 7U < 3) {
        bVar5 = cmsys::SystemTools::FileIsFullPath((__x->_M_dataplus)._M_p);
        if (!bVar5) {
          pcVar12 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
          std::__cxx11::string::operator=((string *)&filename,pcVar12);
          std::__cxx11::string::append((char *)&filename);
        }
        std::__cxx11::string::_M_append((char *)&filename,(ulong)(__x->_M_dataplus)._M_p);
        cmsys::SystemTools::ConvertToUnixSlashes(&filename);
      }
      bVar5 = cmsys::SystemTools::FileIsFullPath(filename._M_dataplus._M_p);
      if (bVar5) {
        cmsys::SystemTools::CollapseFullPath(&dep,&filename);
        std::__cxx11::string::operator=((string *)&filename,(string *)&dep);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dep._M_dataplus._M_p != &dep.field_2) {
          operator_delete(dep._M_dataplus._M_p,dep.field_2._M_allocated_capacity + 1);
        }
      }
      switch(iVar9) {
      case 0:
        std::__cxx11::string::_M_assign((string *)&source);
        bVar5 = true;
        iVar9 = 0;
        goto LAB_00334ea3;
      case 1:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&currentLine.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ,__x);
        iVar9 = 1;
        break;
      case 2:
        std::__cxx11::string::_M_assign((string *)&target);
        iVar9 = 2;
        break;
      case 3:
        dep._M_dataplus._M_p = (pointer)&dep.field_2;
        pcVar2 = (__x->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&dep,pcVar2,pcVar2 + __x->_M_string_length);
        cmsys::SystemTools::ConvertToUnixSlashes(&dep);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depends,&dep);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dep._M_dataplus._M_p != &dep.field_2) {
          operator_delete(dep._M_dataplus._M_p,dep.field_2._M_allocated_capacity + 1);
        }
        iVar9 = 3;
        break;
      case 4:
        std::__cxx11::string::_M_assign((string *)&implicit_depends_lang);
        iVar9 = 5;
        break;
      case 5:
        dep_1._M_dataplus._M_p = (pointer)&dep_1.field_2;
        pcVar2 = (__x->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&dep_1,pcVar2,pcVar2 + __x->_M_string_length);
        cmsys::SystemTools::ConvertToUnixSlashes(&dep_1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depends,&dep_1);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&dep,&implicit_depends_lang,&dep_1);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back(&implicit_depends.
                     super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ,(value_type *)&dep);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&dep);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dep_1._M_dataplus._M_p != &dep_1.field_2) {
          operator_delete(dep_1._M_dataplus._M_p,dep_1.field_2._M_allocated_capacity + 1);
        }
        iVar9 = 4;
        break;
      case 6:
        std::__cxx11::string::_M_assign((string *)&main_dependency);
        iVar9 = 6;
        break;
      case 7:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&output,&filename);
        iVar9 = 7;
        break;
      case 8:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&outputs,&filename);
        iVar9 = 8;
        break;
      case 9:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&byproducts,&filename);
        iVar9 = 9;
        break;
      case 10:
        std::__cxx11::string::_M_assign((string *)&comment_buffer);
        bVar5 = true;
        iVar9 = 10;
        local_360 = comment_buffer._M_dataplus._M_p;
        goto LAB_00334ea3;
      case 0xb:
        std::__cxx11::string::_M_assign((string *)&working);
        iVar9 = 0xb;
        break;
      case 0xc:
        std::__cxx11::string::_M_assign((string *)&depfile);
        iVar9 = 0xc;
        break;
      default:
        dep._M_dataplus._M_p = (pointer)&dep.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&dep,"Wrong syntax. Unknown type of argument.","");
        cmCommand::SetError(&this->super_cmCommand,&dep);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dep._M_dataplus._M_p != &dep.field_2) {
          operator_delete(dep._M_dataplus._M_p,dep.field_2._M_allocated_capacity + 1);
        }
        bVar5 = false;
        goto LAB_00334ea3;
      }
      bVar5 = true;
LAB_00334ea3:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename._M_dataplus._M_p != &filename.field_2) {
        operator_delete(filename._M_dataplus._M_p,
                        CONCAT71(filename.field_2._M_allocated_capacity._1_7_,
                                 filename.field_2._M_local_buf[0]) + 1);
      }
      if (!bVar5) goto LAB_003350c9;
LAB_00334b35:
      pcVar16 = (char *)(ulong)((int)pcVar16 + 1);
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (pcVar16 < (char *)((long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >>
                               5));
    bVar5 = (bool)(bVar6 ^ 1);
    if ((currentLine.
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         currentLine.
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       (std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                  (&commandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                   &currentLine),
       pbVar1 = currentLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,
       pbVar11 = currentLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       currentLine.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish !=
       currentLine.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)) {
      paVar22 = &(currentLine.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        plVar3 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (paVar22 + -1))->_M_dataplus)._M_p;
        if (paVar22 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar3) {
          operator_delete(plVar3,paVar22->_M_allocated_capacity + 1);
        }
        pbVar21 = (pointer)(paVar22 + 1);
        paVar22 = paVar22 + 2;
      } while (pbVar21 != pbVar1);
      currentLine.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar11;
    }
  }
  if (output.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      output.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish && target._M_string_length == 0) {
    dep._M_dataplus._M_p = (pointer)&dep.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&dep,"Wrong syntax. A TARGET or OUTPUT must be specified.","");
    cmCommand::SetError(&this->super_cmCommand,&dep);
LAB_003350ac:
    uVar19 = dep.field_2._M_allocated_capacity;
    _Var20._M_p = dep._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dep._M_dataplus._M_p != &dep.field_2) {
LAB_003350c1:
      operator_delete(_Var20._M_p,uVar19 + 1);
    }
  }
  else {
    if (source._M_string_length == 0 && target._M_string_length != 0) {
      if (output.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          output.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (bVar4) goto LAB_00335075;
        bVar4 = false;
        goto LAB_00335240;
      }
      dep._M_dataplus._M_p = (pointer)&dep.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&dep,"Wrong syntax. A TARGET and OUTPUT can not both be specified.","");
      cmCommand::SetError(&this->super_cmCommand,&dep);
      goto LAB_003350ac;
    }
    if ((bool)(bVar4 & output.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start ==
                       output.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)) {
LAB_00335075:
      dep._M_dataplus._M_p = (pointer)&dep.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&dep,"given APPEND option with no OUTPUT.","");
      cmCommand::SetError(&this->super_cmCommand,&dep);
      goto LAB_003350ac;
    }
LAB_00335240:
    bVar7 = CheckOutputs(this,&output);
    if (((bVar7) && (bVar7 = CheckOutputs(this,&outputs), bVar7)) &&
       (bVar7 = CheckOutputs(this,&byproducts), bVar7)) {
      if (!bVar4) {
        if (working._M_string_length != 0) {
          pcVar16 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
          cmsys::SystemTools::CollapseFullPath(&dep,&working,pcVar16);
          std::__cxx11::string::operator=((string *)&working,(string *)&dep);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dep._M_dataplus._M_p != &dep.field_2) {
            operator_delete(dep._M_dataplus._M_p,dep.field_2._M_allocated_capacity + 1);
          }
        }
        if ((source._M_string_length == 0) &&
           (output.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            output.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          dep._M_dataplus._M_p = (pointer)0x0;
          dep._M_string_length = 0;
          dep.field_2._M_allocated_capacity = 0;
          cmMakefile::AddCustomCommandToTarget
                    ((this->super_cmCommand).Makefile,&target,&byproducts,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&dep,&commandLines,type,local_360,working._M_dataplus._M_p,bVar5,bVar18,
                     &depfile,local_368,RejectObjectLibraryCommands);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&dep);
LAB_00335801:
          bVar18 = true;
          goto LAB_003350cb;
        }
        if (target._M_string_length == 0) {
          cmMakefile::AddCustomCommandToOutput
                    ((this->super_cmCommand).Makefile,&output,&byproducts,&depends,&main_dependency,
                     &commandLines,local_360,working._M_dataplus._M_p,false,bVar5,bVar18,local_368,
                     &depfile);
          bVar18 = true;
          if (implicit_depends.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              implicit_depends.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_003350cb;
          pcVar14 = cmMakefile::GetSourceFileWithOutput
                              ((this->super_cmCommand).Makefile,
                               output.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
          if ((pcVar14 != (cmSourceFile *)0x0) &&
             (pcVar15 = cmSourceFile::GetCustomCommand(pcVar14), pcVar15 != (cmCustomCommand *)0x0))
          {
            cmCustomCommand::SetImplicitDepends(pcVar15,&implicit_depends);
            goto LAB_003350cb;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&dep);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dep,
                     "could not locate source file with a custom command producing \"",0x3e);
          poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&dep,
                               ((output.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                               (output.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar17,"\" even though this command tried to create it!",0x2e);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&filename);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)filename._M_dataplus._M_p != &filename.field_2) {
            operator_delete(filename._M_dataplus._M_p,
                            CONCAT71(filename.field_2._M_allocated_capacity._1_7_,
                                     filename.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_0033545b;
        }
        if (byproducts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            byproducts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (!bVar18) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&dep);
            PVar10 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0050);
            if (PVar10 - NEW < 3) {
              t = FATAL_ERROR;
              bVar18 = true;
LAB_00335742:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&dep,
                         "The SOURCE signatures of add_custom_command are no longer supported.",0x44
                        );
              this_00 = (this->super_cmCommand).Makefile;
              std::__cxx11::stringbuf::str();
              cmMakefile::IssueMessage(this_00,t,&filename);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)filename._M_dataplus._M_p != &filename.field_2) {
                operator_delete(filename._M_dataplus._M_p,
                                CONCAT71(filename.field_2._M_allocated_capacity._1_7_,
                                         filename.field_2._M_local_buf[0]) + 1);
              }
              if (bVar18) goto LAB_0033545b;
            }
            else if (PVar10 != OLD) {
              bVar18 = false;
              t = AUTHOR_WARNING;
              if (PVar10 == WARN) {
                cmPolicies::GetPolicyWarning_abi_cxx11_(&filename,(cmPolicies *)0x32,id);
                poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&dep,filename._M_dataplus._M_p,
                                     filename._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)filename._M_dataplus._M_p != &filename.field_2) {
                  operator_delete(filename._M_dataplus._M_p,
                                  CONCAT71(filename.field_2._M_allocated_capacity._1_7_,
                                           filename.field_2._M_local_buf[0]) + 1);
                }
                bVar18 = false;
                t = AUTHOR_WARNING;
              }
              goto LAB_00335742;
            }
            cmMakefile::AddCustomCommandOldStyle
                      ((this->super_cmCommand).Makefile,&target,&outputs,&depends,&source,
                       &commandLines,local_360);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dep);
            std::ios_base::~ios_base(local_1c8);
            goto LAB_00335801;
          }
          dep._M_dataplus._M_p = (pointer)&dep.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&dep,"USES_TERMINAL may not be used with SOURCE signatures","");
          cmCommand::SetError(&this->super_cmCommand,&dep);
        }
        else {
          dep._M_dataplus._M_p = (pointer)&dep.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&dep,"BYPRODUCTS may not be specified with SOURCE signatures","");
          cmCommand::SetError(&this->super_cmCommand,&dep);
        }
        goto LAB_003350ac;
      }
      pcVar14 = cmMakefile::GetSourceFileWithOutput
                          ((this->super_cmCommand).Makefile,
                           output.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      if ((pcVar14 != (cmSourceFile *)0x0) &&
         (pcVar15 = cmSourceFile::GetCustomCommand(pcVar14), pcVar15 != (cmCustomCommand *)0x0)) {
        cmCustomCommand::AppendCommands(pcVar15,&commandLines);
        cmCustomCommand::AppendDepends(pcVar15,&depends);
        bVar18 = true;
        cmCustomCommand::AppendImplicitDepends(pcVar15,&implicit_depends);
        goto LAB_003350cb;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dep);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&dep,"given APPEND option with output\n\"",0x21);
      poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&dep,
                           ((output.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                           (output.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar17,"\"\nwhich is not already a custom command output.",0x2f);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&filename);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename._M_dataplus._M_p != &filename.field_2) {
        operator_delete(filename._M_dataplus._M_p,
                        CONCAT71(filename.field_2._M_allocated_capacity._1_7_,
                                 filename.field_2._M_local_buf[0]) + 1);
      }
LAB_0033545b:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dep);
      std::ios_base::~ios_base(local_1c8);
    }
  }
LAB_003350c9:
  bVar18 = false;
LAB_003350cb:
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&currentLine.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&implicit_depends.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)implicit_depends_lang._M_dataplus._M_p != &implicit_depends_lang.field_2) {
    operator_delete(implicit_depends_lang._M_dataplus._M_p,
                    CONCAT71(implicit_depends_lang.field_2._M_allocated_capacity._1_7_,
                             implicit_depends_lang.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&byproducts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&output);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_buffer._M_dataplus._M_p != &comment_buffer.field_2) {
    operator_delete(comment_buffer._M_dataplus._M_p,
                    CONCAT71(comment_buffer.field_2._M_allocated_capacity._1_7_,
                             comment_buffer.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)depfile._M_dataplus._M_p != &depfile.field_2) {
    operator_delete(depfile._M_dataplus._M_p,
                    CONCAT71(depfile.field_2._M_allocated_capacity._1_7_,
                             depfile.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)working._M_dataplus._M_p != &working.field_2) {
    operator_delete(working._M_dataplus._M_p,
                    CONCAT71(working.field_2._M_allocated_capacity._1_7_,
                             working.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)main_dependency._M_dataplus._M_p != &main_dependency.field_2) {
    operator_delete(main_dependency._M_dataplus._M_p,
                    CONCAT71(main_dependency.field_2._M_allocated_capacity._1_7_,
                             main_dependency.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)target._M_dataplus._M_p != &target.field_2) {
    operator_delete(target._M_dataplus._M_p,
                    CONCAT71(target.field_2._M_allocated_capacity._1_7_,
                             target.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)source._M_dataplus._M_p != &source.field_2) {
    operator_delete(source._M_dataplus._M_p,
                    CONCAT71(source.field_2._M_allocated_capacity._1_7_,
                             source.field_2._M_local_buf[0]) + 1);
  }
  return bVar18;
}

Assistant:

bool cmAddCustomCommandCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  /* Let's complain at the end of this function about the lack of a particular
     arg. For the moment, let's say that COMMAND, and either TARGET or SOURCE
     are required.
  */
  if (args.size() < 4) {
    this->SetError("called with wrong number of arguments.");
    return false;
  }

  std::string source, target, main_dependency, working, depfile;
  std::string comment_buffer;
  const char* comment = CM_NULLPTR;
  std::vector<std::string> depends, outputs, output, byproducts;
  bool verbatim = false;
  bool append = false;
  bool uses_terminal = false;
  bool command_expand_lists = false;
  std::string implicit_depends_lang;
  cmCustomCommand::ImplicitDependsList implicit_depends;

  // Accumulate one command line at a time.
  cmCustomCommandLine currentLine;

  // Save all command lines.
  cmCustomCommandLines commandLines;

  cmTarget::CustomCommandType cctype = cmTarget::POST_BUILD;

  enum tdoing
  {
    doing_source,
    doing_command,
    doing_target,
    doing_depends,
    doing_implicit_depends_lang,
    doing_implicit_depends_file,
    doing_main_dependency,
    doing_output,
    doing_outputs,
    doing_byproducts,
    doing_comment,
    doing_working_directory,
    doing_depfile,
    doing_nothing
  };

  tdoing doing = doing_nothing;

  for (unsigned int j = 0; j < args.size(); ++j) {
    std::string const& copy = args[j];

    if (copy == "SOURCE") {
      doing = doing_source;
    } else if (copy == "COMMAND") {
      doing = doing_command;

      // Save the current command before starting the next command.
      if (!currentLine.empty()) {
        commandLines.push_back(currentLine);
        currentLine.clear();
      }
    } else if (copy == "PRE_BUILD") {
      cctype = cmTarget::PRE_BUILD;
    } else if (copy == "PRE_LINK") {
      cctype = cmTarget::PRE_LINK;
    } else if (copy == "POST_BUILD") {
      cctype = cmTarget::POST_BUILD;
    } else if (copy == "VERBATIM") {
      verbatim = true;
    } else if (copy == "APPEND") {
      append = true;
    } else if (copy == "USES_TERMINAL") {
      uses_terminal = true;
    } else if (copy == "COMMAND_EXPAND_LISTS") {
      command_expand_lists = true;
    } else if (copy == "TARGET") {
      doing = doing_target;
    } else if (copy == "ARGS") {
      // Ignore this old keyword.
    } else if (copy == "DEPENDS") {
      doing = doing_depends;
    } else if (copy == "OUTPUTS") {
      doing = doing_outputs;
    } else if (copy == "OUTPUT") {
      doing = doing_output;
    } else if (copy == "BYPRODUCTS") {
      doing = doing_byproducts;
    } else if (copy == "WORKING_DIRECTORY") {
      doing = doing_working_directory;
    } else if (copy == "MAIN_DEPENDENCY") {
      doing = doing_main_dependency;
    } else if (copy == "IMPLICIT_DEPENDS") {
      doing = doing_implicit_depends_lang;
    } else if (copy == "COMMENT") {
      doing = doing_comment;
    } else if (copy == "DEPFILE") {
      doing = doing_depfile;
      if (this->Makefile->GetGlobalGenerator()->GetName() != "Ninja") {
        this->SetError("Option DEPFILE not supported by " +
                       this->Makefile->GetGlobalGenerator()->GetName());
        return false;
      }
    } else {
      std::string filename;
      switch (doing) {
        case doing_output:
        case doing_outputs:
        case doing_byproducts:
          if (!cmSystemTools::FileIsFullPath(copy.c_str())) {
            // This is an output to be generated, so it should be
            // under the build tree.  CMake 2.4 placed this under the
            // source tree.  However the only case that this change
            // will break is when someone writes
            //
            //   add_custom_command(OUTPUT out.txt ...)
            //
            // and later references "${CMAKE_CURRENT_SOURCE_DIR}/out.txt".
            // This is fairly obscure so we can wait for someone to
            // complain.
            filename = this->Makefile->GetCurrentBinaryDirectory();
            filename += "/";
          }
          filename += copy;
          cmSystemTools::ConvertToUnixSlashes(filename);
          break;
        case doing_source:
        // We do not want to convert the argument to SOURCE because
        // that option is only available for backward compatibility.
        // Old-style use of this command may use the SOURCE==TARGET
        // trick which we must preserve.  If we convert the source
        // to a full path then it will no longer equal the target.
        default:
          break;
      }

      if (cmSystemTools::FileIsFullPath(filename.c_str())) {
        filename = cmSystemTools::CollapseFullPath(filename);
      }
      switch (doing) {
        case doing_depfile:
          depfile = copy;
          break;
        case doing_working_directory:
          working = copy;
          break;
        case doing_source:
          source = copy;
          break;
        case doing_output:
          output.push_back(filename);
          break;
        case doing_main_dependency:
          main_dependency = copy;
          break;
        case doing_implicit_depends_lang:
          implicit_depends_lang = copy;
          doing = doing_implicit_depends_file;
          break;
        case doing_implicit_depends_file: {
          // An implicit dependency starting point is also an
          // explicit dependency.
          std::string dep = copy;
          cmSystemTools::ConvertToUnixSlashes(dep);
          depends.push_back(dep);

          // Add the implicit dependency language and file.
          cmCustomCommand::ImplicitDependsPair entry(implicit_depends_lang,
                                                     dep);
          implicit_depends.push_back(entry);

          // Switch back to looking for a language.
          doing = doing_implicit_depends_lang;
        } break;
        case doing_command:
          currentLine.push_back(copy);
          break;
        case doing_target:
          target = copy;
          break;
        case doing_depends: {
          std::string dep = copy;
          cmSystemTools::ConvertToUnixSlashes(dep);
          depends.push_back(dep);
        } break;
        case doing_outputs:
          outputs.push_back(filename);
          break;
        case doing_byproducts:
          byproducts.push_back(filename);
          break;
        case doing_comment:
          comment_buffer = copy;
          comment = comment_buffer.c_str();
          break;
        default:
          this->SetError("Wrong syntax. Unknown type of argument.");
          return false;
      }
    }
  }

  // Store the last command line finished.
  if (!currentLine.empty()) {
    commandLines.push_back(currentLine);
    currentLine.clear();
  }

  // At this point we could complain about the lack of arguments.  For
  // the moment, let's say that COMMAND, TARGET are always required.
  if (output.empty() && target.empty()) {
    this->SetError("Wrong syntax. A TARGET or OUTPUT must be specified.");
    return false;
  }

  if (source.empty() && !target.empty() && !output.empty()) {
    this->SetError(
      "Wrong syntax. A TARGET and OUTPUT can not both be specified.");
    return false;
  }
  if (append && output.empty()) {
    this->SetError("given APPEND option with no OUTPUT.");
    return false;
  }

  // Make sure the output names and locations are safe.
  if (!this->CheckOutputs(output) || !this->CheckOutputs(outputs) ||
      !this->CheckOutputs(byproducts)) {
    return false;
  }

  // Check for an append request.
  if (append) {
    // Lookup an existing command.
    if (cmSourceFile* sf =
          this->Makefile->GetSourceFileWithOutput(output[0])) {
      if (cmCustomCommand* cc = sf->GetCustomCommand()) {
        cc->AppendCommands(commandLines);
        cc->AppendDepends(depends);
        cc->AppendImplicitDepends(implicit_depends);
        return true;
      }
    }

    // No command for this output exists.
    std::ostringstream e;
    e << "given APPEND option with output\n\"" << output[0]
      << "\"\nwhich is not already a custom command output.";
    this->SetError(e.str());
    return false;
  }

  // Convert working directory to a full path.
  if (!working.empty()) {
    const char* build_dir = this->Makefile->GetCurrentBinaryDirectory();
    working = cmSystemTools::CollapseFullPath(working, build_dir);
  }

  // Choose which mode of the command to use.
  bool escapeOldStyle = !verbatim;
  if (source.empty() && output.empty()) {
    // Source is empty, use the target.
    std::vector<std::string> no_depends;
    this->Makefile->AddCustomCommandToTarget(
      target, byproducts, no_depends, commandLines, cctype, comment,
      working.c_str(), escapeOldStyle, uses_terminal, depfile,
      command_expand_lists);
  } else if (target.empty()) {
    // Target is empty, use the output.
    this->Makefile->AddCustomCommandToOutput(
      output, byproducts, depends, main_dependency, commandLines, comment,
      working.c_str(), false, escapeOldStyle, uses_terminal,
      command_expand_lists, depfile);

    // Add implicit dependency scanning requests if any were given.
    if (!implicit_depends.empty()) {
      bool okay = false;
      if (cmSourceFile* sf =
            this->Makefile->GetSourceFileWithOutput(output[0])) {
        if (cmCustomCommand* cc = sf->GetCustomCommand()) {
          okay = true;
          cc->SetImplicitDepends(implicit_depends);
        }
      }
      if (!okay) {
        std::ostringstream e;
        e << "could not locate source file with a custom command producing \""
          << output[0] << "\" even though this command tried to create it!";
        this->SetError(e.str());
        return false;
      }
    }
  } else if (!byproducts.empty()) {
    this->SetError("BYPRODUCTS may not be specified with SOURCE signatures");
    return false;
  } else if (uses_terminal) {
    this->SetError("USES_TERMINAL may not be used with SOURCE signatures");
    return false;
  } else {
    bool issueMessage = true;
    std::ostringstream e;
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0050)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0050) << "\n";
        break;
      case cmPolicies::OLD:
        issueMessage = false;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        messageType = cmake::FATAL_ERROR;
        break;
    }

    if (issueMessage) {
      e << "The SOURCE signatures of add_custom_command are no longer "
           "supported.";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == cmake::FATAL_ERROR) {
        return false;
      }
    }

    // Use the old-style mode for backward compatibility.
    this->Makefile->AddCustomCommandOldStyle(target, outputs, depends, source,
                                             commandLines, comment);
  }

  return true;
}